

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u64.c
# Opt level: O3

u64 u64NegInv(u64 w)

{
  long lVar1;
  u64 ret;
  
  lVar1 = (w * w | 2) * w;
  lVar1 = (lVar1 * w + 2) * lVar1;
  lVar1 = (lVar1 * w + 2) * lVar1;
  lVar1 = (lVar1 * w + 2) * lVar1;
  lVar1 = (lVar1 * w + 2) * lVar1;
  return (w * lVar1 + 2) * lVar1;
}

Assistant:

u64 u64NegInv(register u64 w)
{
	register u64 ret = w;
	ASSERT(w & 1);
	ret = ret * (w * ret + 2);
	ret = ret * (w * ret + 2);
	ret = ret * (w * ret + 2);
	ret = ret * (w * ret + 2);
	ret = ret * (w * ret + 2);
	ret = ret * (w * ret + 2);
	w = 0;
	return ret;
}